

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureAttachmentErrorsTest::PrepareObjects
          (TextureAttachmentErrorsTest *this)

{
  code *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  GLenum GVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [16];
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  GLint max_color_attachments;
  int local_2c;
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar6 + 0x6d0))(1,&this->m_fbo_valid);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x143c);
  (**(code **)(lVar6 + 0x78))(0x8d40,this->m_fbo_valid);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x143f);
  (**(code **)(lVar6 + 0x6f8))(1,&this->m_to_valid);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1442);
  (**(code **)(lVar6 + 0xb8))(0xde1,this->m_to_valid);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1445);
  (**(code **)(lVar6 + 0x6f8))(1,&this->m_tbo_valid);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1448);
  (**(code **)(lVar6 + 0xb8))(0x8c2a,this->m_tbo_valid);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x144b);
  (**(code **)(lVar6 + 0x6f8))(1,&this->m_to_3d_valid);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x144e);
  (**(code **)(lVar6 + 0xb8))(0x806f,this->m_to_3d_valid);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1451);
  (**(code **)(lVar6 + 0x6f8))(1,&this->m_to_array_valid);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1454);
  (**(code **)(lVar6 + 0xb8))(0x8c1a,this->m_to_array_valid);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1457);
  (**(code **)(lVar6 + 0x6f8))(1,&this->m_to_cubearray_valid);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x145a);
  (**(code **)(lVar6 + 0xb8))(0x9009,this->m_to_cubearray_valid);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x145d);
  (**(code **)(lVar6 + 0x6f8))(1,&this->m_to_layer_invalid);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1460);
  (**(code **)(lVar6 + 0xb8))(0x84f5,this->m_to_layer_invalid);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1463);
  do {
    pcVar1 = *(code **)(lVar6 + 0xc88);
    this->m_fbo_invalid = this->m_fbo_invalid + 1;
    cVar2 = (*pcVar1)();
  } while (cVar2 != '\0');
  do {
    pcVar1 = *(code **)(lVar6 + 0xcc8);
    this->m_to_invalid = this->m_to_invalid + 1;
    cVar2 = (*pcVar1)();
  } while (cVar2 != '\0');
  local_2c = 8;
  (**(code **)(lVar6 + 0x868))(0x8cdf,&local_2c);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGetIntegerv has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x146e);
  this->m_color_attachment_invalid = local_2c + 0x8ce0;
  GVar7 = this->m_attachment_invalid;
  iVar4 = local_2c + -1;
  auVar10._4_4_ = iVar4;
  auVar10._0_4_ = iVar4;
  auVar10._8_4_ = iVar4;
  auVar10._12_4_ = iVar4;
  auVar10 = auVar10 ^ _DAT_019f5ce0;
  do {
    if (((GVar7 == 0x8219) || (GVar7 == 0x8d1f)) || (GVar7 == 0x8cff)) {
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    GVar7 = GVar7 + 1;
    if (0 < local_2c) {
      auVar12 = ZEXT216(CONCAT11(GVar7 == 0x8ce0,GVar7 == 0x8ce0));
      auVar12 = pshuflw(auVar12,auVar12,0);
      auVar13._0_4_ = auVar12._0_4_;
      auVar13._4_4_ = auVar13._0_4_;
      auVar13._8_4_ = auVar13._0_4_;
      auVar13._12_4_ = auVar13._0_4_;
      auVar12 = (undefined1  [16])0x0;
      iVar4 = 0x10;
      do {
        auVar14 = auVar12;
        iVar8 = iVar4 + -0x10;
        iVar9 = iVar4 + (local_2c + 0xfU & 0xfffffff0);
        auVar12 = auVar13;
        iVar4 = iVar8;
      } while (iVar9 != 0x20);
      iVar8 = -iVar8;
      auVar12._4_4_ = iVar8;
      auVar12._0_4_ = iVar8;
      auVar12._8_4_ = iVar8;
      auVar12._12_4_ = iVar8;
      auVar15 = (auVar12 | _DAT_01a25d60) ^ _DAT_019f5ce0;
      iVar4 = auVar10._0_4_;
      auVar18._0_4_ = -(uint)(iVar4 < auVar15._0_4_);
      iVar8 = auVar10._4_4_;
      auVar18._4_4_ = -(uint)(iVar8 < auVar15._4_4_);
      iVar9 = auVar10._8_4_;
      auVar18._8_4_ = -(uint)(iVar9 < auVar15._8_4_);
      iVar11 = auVar10._12_4_;
      auVar18._12_4_ = -(uint)(iVar11 < auVar15._12_4_);
      auVar15 = (auVar12 | _DAT_01a25d70) ^ _DAT_019f5ce0;
      auVar17._0_4_ = -(uint)(iVar4 < auVar15._0_4_);
      auVar17._4_4_ = -(uint)(iVar8 < auVar15._4_4_);
      auVar17._8_4_ = -(uint)(iVar9 < auVar15._8_4_);
      auVar17._12_4_ = -(uint)(iVar11 < auVar15._12_4_);
      auVar18 = packssdw(auVar17,auVar18);
      auVar15 = (auVar12 | _DAT_01a1fb20) ^ _DAT_019f5ce0;
      auVar16._0_4_ = -(uint)(iVar4 < auVar15._0_4_);
      auVar16._4_4_ = -(uint)(iVar8 < auVar15._4_4_);
      auVar16._8_4_ = -(uint)(iVar9 < auVar15._8_4_);
      auVar16._12_4_ = -(uint)(iVar11 < auVar15._12_4_);
      auVar12 = (auVar12 | _s_validInterpolations) ^ _DAT_019f5ce0;
      auVar15._0_4_ = -(uint)(iVar4 < auVar12._0_4_);
      auVar15._4_4_ = -(uint)(iVar8 < auVar12._4_4_);
      auVar15._8_4_ = -(uint)(iVar9 < auVar12._8_4_);
      auVar15._12_4_ = -(uint)(iVar11 < auVar12._12_4_);
      auVar12 = packssdw(auVar15,auVar16);
      auVar12 = packsswb(auVar12,auVar18);
      auVar12 = psllw(~auVar12 & auVar13 | auVar14 & auVar12,7);
      bVar3 = (bool)(((((((((((((((((auVar12 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar12 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar12 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar12 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar12 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar12 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar12 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar12 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar12 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar12 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar12 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar12 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar12 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar12 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     auVar12[0xf] < '\0') | bVar3);
    }
  } while (bVar3);
  this->m_attachment_invalid = GVar7;
  (**(code **)(lVar6 + 0x868))(0x8073,&this->m_max_3d_texture_size);
  (**(code **)(lVar6 + 0x868))(0x88ff,&this->m_max_array_texture_layers);
  (**(code **)(lVar6 + 0x868))(0x851c,&this->m_max_cube_map_texture_size);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_NV_deep_texture3D");
  if (bVar3) {
    (**(code **)(lVar6 + 0x868))(0x90d1);
  }
  else {
    this->m_max_3d_texture_depth = this->m_max_3d_texture_size;
  }
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGetIntegerv has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1499);
  this->m_level_invalid = -1;
  return;
}

Assistant:

void TextureAttachmentErrorsTest::PrepareObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Valid objects. */
	gl.genFramebuffers(1, &m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	gl.genTextures(1, &m_to_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(GL_TEXTURE_2D, m_to_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.genTextures(1, &m_tbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(GL_TEXTURE_BUFFER, m_tbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	gl.genTextures(1, &m_to_3d_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(GL_TEXTURE_3D, m_to_3d_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	gl.genTextures(1, &m_to_array_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_to_array_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	gl.genTextures(1, &m_to_cubearray_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_to_cubearray_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	gl.genTextures(1, &m_to_layer_invalid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(GL_TEXTURE_RECTANGLE, m_to_layer_invalid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Invalid objects. */
	while (gl.isFramebuffer(++m_fbo_invalid))
		;
	while (gl.isTexture(++m_to_invalid))
		;

	/* Max color attachments query. */
	glw::GLint max_color_attachments = 8; /* Spec default. */
	gl.getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &max_color_attachments);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

	/* Invalid color attachment */
	m_color_attachment_invalid = GL_COLOR_ATTACHMENT0 + max_color_attachments;

	/* Invalid attachment. */
	bool is_attachment = true;

	while (is_attachment)
	{
		++m_attachment_invalid;

		is_attachment = false;

		if ((GL_DEPTH_ATTACHMENT == m_attachment_invalid) || (GL_STENCIL_ATTACHMENT == m_attachment_invalid) ||
			(GL_DEPTH_STENCIL_ATTACHMENT == m_attachment_invalid))
		{
			is_attachment = true;
		}

		for (glw::GLint i = 0; i < max_color_attachments; ++i)
		{
			if (GL_COLOR_ATTACHMENT0 == m_attachment_invalid)
			{
				is_attachment = true;
			}
		}
	}

	/* Maximum values */
	gl.getIntegerv(GL_MAX_3D_TEXTURE_SIZE, &m_max_3d_texture_size);
	gl.getIntegerv(GL_MAX_ARRAY_TEXTURE_LAYERS, &m_max_array_texture_layers);
	gl.getIntegerv(GL_MAX_CUBE_MAP_TEXTURE_SIZE, &m_max_cube_map_texture_size);

	if (m_context.getContextInfo().isExtensionSupported("GL_NV_deep_texture3D"))
	{
		gl.getIntegerv(GL_MAX_DEEP_3D_TEXTURE_DEPTH_NV, &m_max_3d_texture_depth);
	}
	else
	{
		m_max_3d_texture_depth = m_max_3d_texture_size;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

	/* Invalid level. */
	m_level_invalid = -1;
}